

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void * parse_fun(Parser *parser,Modifier *modifier)

{
  Token *name;
  List *args;
  void *pvVar1;
  FunStmt *pFVar2;
  
  name = parser->token;
  move(parser);
  expect(parser,OP_BRA);
  args = new_list();
  while (parser->token->kind != CL_BRA) {
    pvVar1 = parse_stmt(parser);
    list_add(args,pvVar1);
    if (parser->token->kind != CL_BRA) {
      expect(parser,COMM);
    }
  }
  expect(parser,CL_BRA);
  pvVar1 = parse_block(parser);
  pFVar2 = new_fun_stmt(name,args,pvVar1,modifier);
  return pFVar2;
}

Assistant:

void *parse_fun(Parser *parser, Modifier *modifier) {
    Token *name = token(parser);
    move(parser);
    expect(parser, OP_BRA);
    List *args = new_list();
    while (token(parser)->kind != CL_BRA) {
        list_add(args, parse_stmt(parser));
        if (token(parser)->kind != CL_BRA) {
            expect(parser, COMM);
        }
    }
    expect(parser, CL_BRA);
    void *block = parse_block(parser);
    return new_fun_stmt(name, args, block, modifier);
}